

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void dump_objects(ang_file *fff)

{
  object_kind *poVar1;
  char *pcVar2;
  angband_constants *paVar3;
  long lVar4;
  ulong uVar5;
  char name [120];
  
  file_putf(fff,"# Objects\n");
  lVar4 = 9;
  paVar3 = z_info;
  for (uVar5 = 0; poVar1 = k_info, uVar5 < paVar3->k_max; uVar5 = uVar5 + 1) {
    name[0x60] = '\0';
    name[0x61] = '\0';
    name[0x62] = '\0';
    name[99] = '\0';
    name[100] = '\0';
    name[0x65] = '\0';
    name[0x66] = '\0';
    name[0x67] = '\0';
    name[0x68] = '\0';
    name[0x69] = '\0';
    name[0x6a] = '\0';
    name[0x6b] = '\0';
    name[0x6c] = '\0';
    name[0x6d] = '\0';
    name[0x6e] = '\0';
    name[0x6f] = '\0';
    name[0x50] = '\0';
    name[0x51] = '\0';
    name[0x52] = '\0';
    name[0x53] = '\0';
    name[0x54] = '\0';
    name[0x55] = '\0';
    name[0x56] = '\0';
    name[0x57] = '\0';
    name[0x58] = '\0';
    name[0x59] = '\0';
    name[0x5a] = '\0';
    name[0x5b] = '\0';
    name[0x5c] = '\0';
    name[0x5d] = '\0';
    name[0x5e] = '\0';
    name[0x5f] = '\0';
    name[0x40] = '\0';
    name[0x41] = '\0';
    name[0x42] = '\0';
    name[0x43] = '\0';
    name[0x44] = '\0';
    name[0x45] = '\0';
    name[0x46] = '\0';
    name[0x47] = '\0';
    name[0x48] = '\0';
    name[0x49] = '\0';
    name[0x4a] = '\0';
    name[0x4b] = '\0';
    name[0x4c] = '\0';
    name[0x4d] = '\0';
    name[0x4e] = '\0';
    name[0x4f] = '\0';
    name[0x30] = '\0';
    name[0x31] = '\0';
    name[0x32] = '\0';
    name[0x33] = '\0';
    name[0x34] = '\0';
    name[0x35] = '\0';
    name[0x36] = '\0';
    name[0x37] = '\0';
    name[0x38] = '\0';
    name[0x39] = '\0';
    name[0x3a] = '\0';
    name[0x3b] = '\0';
    name[0x3c] = '\0';
    name[0x3d] = '\0';
    name[0x3e] = '\0';
    name[0x3f] = '\0';
    name[0x20] = '\0';
    name[0x21] = '\0';
    name[0x22] = '\0';
    name[0x23] = '\0';
    name[0x24] = '\0';
    name[0x25] = '\0';
    name[0x26] = '\0';
    name[0x27] = '\0';
    name[0x28] = '\0';
    name[0x29] = '\0';
    name[0x2a] = '\0';
    name[0x2b] = '\0';
    name[0x2c] = '\0';
    name[0x2d] = '\0';
    name[0x2e] = '\0';
    name[0x2f] = '\0';
    name[0x70] = '\0';
    name[0x71] = '\0';
    name[0x72] = '\0';
    name[0x73] = '\0';
    name[0x74] = '\0';
    name[0x75] = '\0';
    name[0x76] = '\0';
    name[0x77] = '\0';
    name[0x10] = '\0';
    name[0x11] = '\0';
    name[0x12] = '\0';
    name[0x13] = '\0';
    name[0x14] = '\0';
    name[0x15] = '\0';
    name[0x16] = '\0';
    name[0x17] = '\0';
    name[0x18] = '\0';
    name[0x19] = '\0';
    name[0x1a] = '\0';
    name[0x1b] = '\0';
    name[0x1c] = '\0';
    name[0x1d] = '\0';
    name[0x1e] = '\0';
    name[0x1f] = '\0';
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    pcVar2 = *(char **)((long)k_info + lVar4 * 4 + -0x24);
    if ((pcVar2 != (char *)0x0) && (*(int *)(k_info->flags + lVar4 * 4 + -0x80) != 0)) {
      object_short_name(name,0x78,pcVar2);
      pcVar2 = tval_find_name(*(wchar_t *)(poVar1->flags + lVar4 * 4 + -0x80));
      file_putf(fff,"object:%s:%s:%d:%d\n",pcVar2,name,(ulong)kind_x_attr[uVar5],
                (ulong)(uint)kind_x_char[uVar5]);
      paVar3 = z_info;
    }
    lVar4 = lVar4 + 0xa8;
  }
  return;
}

Assistant:

void dump_objects(ang_file *fff)
{
	int i;

	file_putf(fff, "# Objects\n");

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		char name[120] = "";

		if (!kind->name || !kind->tval) continue;

		object_short_name(name, sizeof name, kind->name);
		file_putf(fff, "object:%s:%s:%d:%d\n", tval_find_name(kind->tval),
				name, kind_x_attr[i], kind_x_char[i]);
	}
}